

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O2

uchar metacall_value_cast_bool(void **v)

{
  uchar uVar1;
  type_id tVar2;
  value v_00;
  
  tVar2 = value_type_id(*v);
  v_00 = *v;
  if (tVar2 != 0) {
    v_00 = value_type_cast(v_00,0);
    if (v_00 == (value)0x0) {
      v_00 = *v;
    }
    else {
      *v = v_00;
    }
  }
  uVar1 = value_to_bool(v_00);
  return uVar1;
}

Assistant:

boolean metacall_value_cast_bool(void **v)
{
	if (value_type_id(*v) != TYPE_BOOL)
	{
		value v_cast = value_type_cast(*v, TYPE_BOOL);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_bool(*v);
}